

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

bool __thiscall kj::anon_unknown_8::rmrf(anon_unknown_8 *this,int fd,StringPtr path)

{
  int iVar1;
  int iVar2;
  Fault *this_00;
  int __fd;
  undefined4 in_register_00000034;
  char *__file;
  Fault f_1;
  Fault f;
  stat stats;
  Fault local_d0;
  Fault local_c8;
  undefined8 uStack_c0;
  StringPtr local_b8;
  stat local_a8;
  
  __file = (char *)CONCAT44(in_register_00000034,fd);
  local_b8.content.size_ = (size_t)path.content.ptr;
  local_b8.content.ptr = __file;
  do {
    __fd = (int)this;
    iVar1 = fstatat(__fd,__file,&local_a8,0x100);
    if (-1 < iVar1) goto LAB_0024d598;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    if (iVar1 == 2) {
      return false;
    }
    if (iVar1 == 0x14) {
      return false;
    }
    this_00 = &local_c8;
    kj::_::Debug::Fault::Fault<int,kj::StringPtr&>
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0xd0,iVar1,"lstat(path)","path",&local_b8);
    goto LAB_0024d6e2;
  }
LAB_0024d598:
  if ((local_a8.st_mode & 0xf000) == 0x4000) {
    do {
      iVar1 = openat(__fd,__file,0x90000);
      if (-1 < iVar1) goto LAB_0024d5d8;
      iVar2 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar2 == -1);
    if (iVar2 == 0) {
LAB_0024d5d8:
      rmrfChildrenAndClose(iVar1);
      do {
        iVar1 = unlinkat(__fd,__file,0x200);
        if (-1 < iVar1) {
          return true;
        }
        iVar1 = kj::_::Debug::getOsErrorNumber(false);
      } while (iVar1 == -1);
      goto joined_r0x0024d66d;
    }
  }
  else {
    do {
      iVar1 = unlinkat(__fd,__file,0);
      if (-1 < iVar1) {
        return true;
      }
      iVar1 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar1 == -1);
joined_r0x0024d66d:
    if (iVar1 == 0) {
      return true;
    }
  }
  uStack_c0 = 0;
  local_c8.exception = (Exception *)0x0;
  local_d0.exception = (Exception *)0x0;
  this_00 = &local_d0;
  kj::_::Debug::Fault::init
            (this_00,(EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
            );
LAB_0024d6e2:
  kj::_::Debug::Fault::~Fault(this_00);
  return false;
}

Assistant:

static bool rmrf(int fd, StringPtr path) {
  struct stat stats;
  KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, path.cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
    case ENOENT:
    case ENOTDIR:
      // Doesn't exist.
      return false;
    default:
      KJ_FAIL_SYSCALL("lstat(path)", error, path) { return false; }
  }

  if (S_ISDIR(stats.st_mode)) {
    int subdirFd;
    KJ_SYSCALL(subdirFd = openat(
        fd, path.cStr(), O_RDONLY | MAYBE_O_DIRECTORY | MAYBE_O_CLOEXEC)) { return false; }
    rmrfChildrenAndClose(subdirFd);
    KJ_SYSCALL(unlinkat(fd, path.cStr(), AT_REMOVEDIR)) { return false; }
  } else {
    KJ_SYSCALL(unlinkat(fd, path.cStr(), 0)) { return false; }
  }

  return true;
}